

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall ON_EarthAnchorPoint::Write(ON_EarthAnchorPoint *this,ON_BinaryArchive *file)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint i;
  double dVar5;
  double dVar6;
  
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,2);
  if (!bVar2) {
    return false;
  }
  dVar6 = this->m_earth_latitude;
  iVar4 = ON_BinaryArchive::Archive3dmVersion(file);
  dVar5 = 0.0;
  if (0x3b < iVar4) {
    dVar5 = dVar6;
  }
  dVar1 = this->m_earth_longitude;
  iVar4 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar2 = ON_BinaryArchive::WriteDouble
                    (file,(double)(~-(ulong)(dVar6 == -1.23432101234321e+308) & (ulong)dVar6 |
                                  (ulong)dVar5 & -(ulong)(dVar6 == -1.23432101234321e+308)));
  if (bVar2) {
    dVar6 = 0.0;
    if (0x3b < iVar4) {
      dVar6 = dVar1;
    }
    bVar2 = ON_BinaryArchive::WriteDouble
                      (file,(double)(~-(ulong)(dVar1 == -1.23432101234321e+308) & (ulong)dVar1 |
                                    (ulong)dVar6 & -(ulong)(dVar1 == -1.23432101234321e+308)));
    if ((((bVar2) &&
         (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_earth_elevation_meters), bVar2)) &&
        (bVar2 = ON_BinaryArchive::WritePoint(file,&this->m_model_point), bVar2)) &&
       ((bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_model_north), bVar2 &&
        (bVar2 = ON_BinaryArchive::WriteVector(file,&this->m_model_east), bVar2)))) {
      i = 2;
      if (this->m_earth_coordinate_system != CenterOfEarth) {
        i = (uint)(this->m_earth_coordinate_system == MeanSeaLevel);
      }
      bVar2 = ON_BinaryArchive::WriteInt(file,i);
      if (((bVar2) && (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_id), bVar2)) &&
         ((bVar2 = ON_BinaryArchive::WriteString(file,&this->m_name), bVar2 &&
          (((bVar2 = ON_BinaryArchive::WriteString(file,&this->m_description), bVar2 &&
            (bVar2 = ON_BinaryArchive::WriteString(file,&this->m_url), bVar2)) &&
           (bVar2 = ON_BinaryArchive::WriteString(file,&this->m_url_tag), bVar2)))))) {
        bVar2 = ON_BinaryArchive::WriteInt(file,(uint)Unset.m_earth_coordinate_system);
        goto LAB_0037923f;
      }
    }
  }
  bVar2 = false;
LAB_0037923f:
  bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool ON_EarthAnchorPoint::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2);
  if ( !rc )
    return false;

  for(;;)
  {
    const double earth_latitude = Internal_UnsetToZeroInV5Files(file, m_earth_latitude);
    const double earth_longitude = Internal_UnsetToZeroInV5Files(file, m_earth_longitude);
    rc = file.WriteDouble(earth_latitude);
    if (!rc) break;
    rc = file.WriteDouble(earth_longitude);
    if (!rc) break;
    rc = file.WriteDouble(m_earth_elevation_meters);
    if (!rc) break;
    rc = file.WritePoint(m_model_point);
    if (!rc) break;
    rc = file.WriteVector(m_model_north);
    if (!rc) break;
    rc = file.WriteVector(m_model_east);
    if (!rc) break;

    // 1.1 fields
    int earth_basepoint_elevation_zero;
    switch (m_earth_coordinate_system)
    {
    case ON::EarthCoordinateSystem::GroundLevel:
      earth_basepoint_elevation_zero = 0;
      break;
    case ON::EarthCoordinateSystem::MeanSeaLevel:
      earth_basepoint_elevation_zero = 1;
      break;
    case ON::EarthCoordinateSystem::CenterOfEarth:
      earth_basepoint_elevation_zero = 2;
      break;
    default:
      earth_basepoint_elevation_zero = 0;
      break;
    }
    rc = file.WriteInt(earth_basepoint_elevation_zero); // legacy value for old files
    if (!rc) break;
    rc = file.WriteUuid(m_id);
    if (!rc) break;
    rc = file.WriteString(m_name);
    if (!rc) break;
    rc = file.WriteString(m_description);
    if (!rc) break;
    rc = file.WriteString(m_url);
    if (!rc) break;
    rc = file.WriteString(m_url_tag);
    if (!rc) break;

    // 1.2 fields
    unsigned int u;
    u = static_cast<unsigned char>(ON_EarthAnchorPoint::Unset.EarthCoordinateSystem());
    rc = file.WriteInt(u);
    if (!rc) break;

    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}